

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryReplaceNode
          (DiskHandle *this,PathPtr path,WriteMode mode,Function<int_(kj::StringPtr)> *tryCreate)

{
  Iface *pIVar1;
  PathPtr finalName;
  size_t sVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  uint code;
  char *pcVar7;
  char *pcVar8;
  StringPtr toPath;
  PathPtr PVar9;
  StringPtr fromPath;
  Fault f;
  String filename;
  Fault f_2;
  PathPtr local_b8;
  Fault local_a8;
  String local_a0;
  Function<int_(kj::StringPtr)> local_88;
  Function<int_(kj::StringPtr)> local_78;
  String local_68;
  Maybe<kj::String> local_50;
  
  local_b8.parts.size_ = path.parts.size_;
  local_b8.parts.ptr = path.parts.ptr;
  if (local_b8.parts.size_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x39c,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    kj::_::Debug::Fault::~Fault(&local_a8);
    return false;
  }
  PathPtr::toString(&local_68,&local_b8,false);
  if ((mode & CREATE) != 0) {
    do {
      pcVar7 = "";
      if (local_68.content.size_ != 0) {
        pcVar7 = local_68.content.ptr;
      }
      pIVar1 = (tryCreate->impl).ptr;
      iVar6 = (**pIVar1->_vptr_Iface)
                        (pIVar1,pcVar7,local_68.content.size_ + (local_68.content.size_ == 0));
      if (-1 < iVar6) {
        iVar6 = 0;
        break;
      }
      iVar6 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar6 == -1);
    if (iVar6 == 0) {
      bVar3 = true;
LAB_0025c068:
      cVar4 = '\0';
    }
    else {
      if (iVar6 == 2) {
        if (((mode & CREATE_PARENT) != 0) && (local_b8.parts.size_ != 0)) {
          PVar9 = PathPtr::parent(&local_b8);
          bVar3 = tryMkdir(this,PVar9,CREATE_PARENT|MODIFY|CREATE,true);
          if (bVar3) {
            PVar9.parts.size_ = local_b8.parts.size_;
            PVar9.parts.ptr = local_b8.parts.ptr;
            local_78.impl.disposer = (tryCreate->impl).disposer;
            local_78.impl.ptr = (tryCreate->impl).ptr;
            (tryCreate->impl).ptr = (Iface *)0x0;
            bVar3 = tryReplaceNode(this,PVar9,mode & ~CREATE_PARENT,&local_78);
            pIVar1 = local_78.impl.ptr;
            if (local_78.impl.ptr != (Iface *)0x0) {
              local_78.impl.ptr = (Iface *)0x0;
              (**(local_78.impl.disposer)->_vptr_Disposer)
                        (local_78.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface
                        );
            }
            goto LAB_0025c068;
          }
        }
LAB_0025c029:
        kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
                  (&local_a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x3b5,iVar6,"create(path)","path",&local_b8);
        kj::_::Debug::Fault::~Fault(&local_a8);
        cVar4 = '\0';
      }
      else {
        if (iVar6 != 0x11) goto LAB_0025c029;
        cVar4 = (char)((mode & MODIFY) >> 1);
      }
      bVar3 = false;
    }
    if (cVar4 == '\0') goto LAB_0025c1d7;
  }
  finalName.parts.size_ = local_b8.parts.size_;
  finalName.parts.ptr = local_b8.parts.ptr;
  local_88.impl.disposer = (tryCreate->impl).disposer;
  local_88.impl.ptr = (tryCreate->impl).ptr;
  (tryCreate->impl).ptr = (Iface *)0x0;
  createNamedTemporary(&local_50,this,finalName,mode,&local_88);
  pIVar1 = local_88.impl.ptr;
  local_a8.exception._0_1_ = local_50.ptr.isSet;
  if (local_50.ptr.isSet == true) {
    local_a0.content.ptr = local_50.ptr.field_1.value.content.ptr;
    local_a0.content.size_ = local_50.ptr.field_1.value.content.size_;
    local_a0.content.disposer = local_50.ptr.field_1.value.content.disposer;
    local_50.ptr.field_1.value.content.ptr = (char *)0x0;
    local_50.ptr.field_1.value.content.size_ = 0;
  }
  if (local_88.impl.ptr != (Iface *)0x0) {
    local_88.impl.ptr = (Iface *)0x0;
    (**(local_88.impl.disposer)->_vptr_Disposer)
              (local_88.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  if ((char)local_a8.exception == '\x01') {
    pcVar7 = "";
    if (local_68.content.size_ != 0) {
      pcVar7 = local_68.content.ptr;
    }
    toPath.content.size_ = local_68.content.size_ + (local_68.content.size_ == 0);
    pcVar8 = "";
    if (local_a0.content.size_ != 0) {
      pcVar8 = local_a0.content.ptr;
    }
    fromPath.content.size_ = local_a0.content.size_ + (local_a0.content.size_ == 0);
    toPath.content.ptr = pcVar7;
    fromPath.content.ptr = pcVar8;
    bVar5 = tryCommitReplacement(this,toPath,(this->fd).fd,fromPath,mode,(int *)0x0);
    bVar3 = true;
    if (!bVar5) {
      do {
        pcVar7 = "";
        if (local_a0.content.size_ != 0) {
          pcVar7 = local_a0.content.ptr;
        }
        code = 0;
        iVar6 = unlinkat((this->fd).fd,pcVar7,0);
      } while ((iVar6 < 0) && (code = kj::_::Debug::getOsErrorNumber(false), code == 0xffffffff));
      if ((code & 0xfffffffd) != 0) {
        kj::_::Debug::Fault::Fault<int,kj::String&>
                  ((Fault *)&local_50,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x3c8,code,"unlinkat(fd, tempPath, 0)","*tempPath",&local_a0);
        kj::_::Debug::Fault::fatal((Fault *)&local_50);
      }
      goto LAB_0025c1a2;
    }
  }
  else {
LAB_0025c1a2:
    bVar3 = false;
  }
  sVar2 = local_a0.content.size_;
  pcVar7 = local_a0.content.ptr;
  if (((char)local_a8.exception == '\x01') && (local_a0.content.ptr != (char *)0x0)) {
    local_a0.content.ptr = (char *)0x0;
    local_a0.content.size_ = 0;
    (**(local_a0.content.disposer)->_vptr_ArrayDisposer)
              (local_a0.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
LAB_0025c1d7:
  sVar2 = local_68.content.size_;
  pcVar7 = local_68.content.ptr;
  if (local_68.content.ptr != (char *)0x0) {
    local_68.content.ptr = (char *)0x0;
    local_68.content.size_ = 0;
    (**(local_68.content.disposer)->_vptr_ArrayDisposer)
              (local_68.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  return bVar3;
}

Assistant:

bool tryReplaceNode(PathPtr path, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Replaces the given path with an object created by calling tryCreate().
    //
    // tryCreate() must behave like a syscall which creates the node at the path passed to it,
    // returning a negative value on error. If the path passed to tryCreate already exists, it
    // MUST fail with EEXIST.
    //
    // When `mode` includes MODIFY, replaceNode() reacts to EEXIST by creating the node in a
    // temporary location and then rename()ing it into place.

    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { return false; }
    }

    auto filename = path.toString();

    if (has(mode, WriteMode::CREATE)) {
      // First try just cerating the node in-place.
      KJ_SYSCALL_HANDLE_ERRORS(tryCreate(filename)) {
        case EEXIST:
          // Target exists.
          if (has(mode, WriteMode::MODIFY)) {
            // Fall back to MODIFY path, below.
            break;
          } else {
            return false;
          }
        case ENOENT:
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryReplaceNode(path, mode - WriteMode::CREATE_PARENT, kj::mv(tryCreate));
          }
          // fallthrough
        default:
          KJ_FAIL_SYSCALL("create(path)", error, path) { return false; }
      } else {
        // Success.
        return true;
      }
    }

    // Either we don't have CREATE mode or the target already exists. We need to perform a
    // replacement instead.

    KJ_IF_MAYBE(tempPath, createNamedTemporary(path, mode, kj::mv(tryCreate))) {
      if (tryCommitReplacement(filename, fd, *tempPath, mode)) {
        return true;
      } else {
        KJ_SYSCALL_HANDLE_ERRORS(unlinkat(fd, tempPath->cStr(), 0)) {
          case ENOENT:
            // meh
            break;
          default:
            KJ_FAIL_SYSCALL("unlinkat(fd, tempPath, 0)", error, *tempPath);
        }
        return false;
      }
    } else {
      // threw, but exceptions are disabled
      return false;
    }
  }